

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O2

void __thiscall CFG::eliminateEpsilonProductions(CFG *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  ostream *poVar3;
  pointer ppPVar4;
  char *this_00;
  pointer pbVar5;
  int i;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  string symbol;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  pointer local_80;
  pointer local_78;
  string local_70;
  string local_50;
  
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  expandNullableSymbols(this,&local_98);
  this_00 = "Nullable symbols: ";
  poVar3 = std::operator<<((ostream *)&std::cout,"Nullable symbols: ");
  vecToStr(&local_70,(CFG *)this_00,&local_98);
  poVar3 = std::operator<<(poVar3,(string *)&local_70);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string((string *)&local_70);
  local_80 = local_98.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  pbVar5 = local_98.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (pbVar5 == local_80) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_98);
      return;
    }
    local_78 = pbVar5;
    std::__cxx11::string::string((string *)&local_70,(string *)pbVar5);
    uVar7 = (ulong)((long)(this->productionsP).
                          super__Vector_base<Production_*,_std::allocator<Production_*>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(this->productionsP).
                         super__Vector_base<Production_*,_std::allocator<Production_*>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 3;
    uVar8 = uVar7 & 0xffffffff;
    if ((int)uVar7 < 1) {
      uVar8 = 0;
    }
    for (uVar7 = 0; uVar8 != uVar7; uVar7 = uVar7 + 1) {
      std::__cxx11::string::string((string *)&local_50,(string *)&local_70);
      removeNullableSymbol
                (this,&local_50,
                 (this->productionsP).
                 super__Vector_base<Production_*,_std::allocator<Production_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar7]);
      std::__cxx11::string::~string((string *)&local_50);
    }
    iVar6 = 0;
    while( true ) {
      uVar7 = (ulong)iVar6;
      ppPVar4 = (this->productionsP).super__Vector_base<Production_*,_std::allocator<Production_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->productionsP).
                        super__Vector_base<Production_*,_std::allocator<Production_*>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)ppPVar4 >> 3) <= uVar7) break;
      __lhs = (ppPVar4[uVar7]->toP).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
      pbVar1 = *(pointer *)
                ((long)&(ppPVar4[uVar7]->toP).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl + 8);
      if (__lhs == pbVar1) {
LAB_0012105d:
        std::vector<Production_*,_std::allocator<Production_*>_>::erase
                  (&this->productionsP,(const_iterator)(ppPVar4 + uVar7));
        iVar6 = iVar6 + -1;
      }
      else if ((long)pbVar1 - (long)__lhs == 0x20) {
        bVar2 = std::operator==(__lhs,"e");
        if (bVar2) {
          ppPVar4 = (this->productionsP).
                    super__Vector_base<Production_*,_std::allocator<Production_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          goto LAB_0012105d;
        }
      }
      iVar6 = iVar6 + 1;
    }
    std::__cxx11::string::~string((string *)&local_70);
    pbVar5 = local_78 + 1;
  } while( true );
}

Assistant:

void CFG::eliminateEpsilonProductions() {
    std::vector<std::string> nullableSymbols = {};
    while (expandNullableSymbols(nullableSymbols)) {}

    std::cout << "Nullable symbols: " << vecToStr(nullableSymbols) << std::endl;

    for (std::string symbol: nullableSymbols) {
        int pSize = productionsP.size();
        for (int i = 0; i < pSize; ++i) {
            removeNullableSymbol(symbol, productionsP[i]);
        }

        for (int i = 0; i < productionsP.size(); ++i) {
            if (productionsP[i]->getToP().empty() or
                (productionsP[i]->getToP().size() == 1 and
                 productionsP[i]->getToP()[0] == "e")) {
                // Transition A -> e
                productionsP.erase(productionsP.begin() + i);
                i--;
            }
        }
    }
}